

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::UdpPortListSyntax::isKind(SyntaxKind kind)

{
  bool bVar1;
  
  bVar1 = true;
  if (((kind != AnsiUdpPortList) && (kind != NonAnsiUdpPortList)) && (kind != WildcardUdpPortList))
  {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool UdpPortListSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AnsiUdpPortList:
        case SyntaxKind::NonAnsiUdpPortList:
        case SyntaxKind::WildcardUdpPortList:
            return true;
        default:
            return false;
    }
}